

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O1

int quicly_local_cid_on_lost(quicly_local_cid_set_t *set,uint64_t sequence)

{
  uint64_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  en_quicly_local_cid_state_t eVar13;
  undefined4 uVar14;
  en_quicly_local_cid_state_t eVar15;
  undefined4 uVar16;
  size_t sVar17;
  size_t sVar18;
  quicly_local_cid_t *pqVar19;
  quicly_local_cid_t *pqVar20;
  uint64_t *puVar21;
  bool bVar22;
  quicly_local_cid_t tmp;
  
  sVar17 = 0xffffffffffffffff;
  if (set->_size != 0) {
    puVar21 = &set->cids[0].sequence;
    sVar18 = 0;
    do {
      sVar17 = sVar18;
      if (*puVar21 == sequence) break;
      sVar18 = sVar18 + 1;
      puVar21 = puVar21 + 7;
      sVar17 = 0xffffffffffffffff;
    } while (set->_size != sVar18);
  }
  pqVar20 = set->cids;
  if ((sVar17 == 0xffffffffffffffff) || (pqVar20[sVar17].state == QUICLY_LOCAL_CID_STATE_DELIVERED))
  {
    bVar22 = pqVar20->state == QUICLY_LOCAL_CID_STATE_PENDING;
  }
  else {
    pqVar19 = pqVar20 + sVar17;
    pqVar19->state = QUICLY_LOCAL_CID_STATE_PENDING;
    bVar22 = true;
    for (; sVar17 != 0; sVar17 = sVar17 - 1) {
      if (pqVar20->state != QUICLY_LOCAL_CID_STATE_PENDING) {
        eVar15 = pqVar20->state;
        uVar16 = *(undefined4 *)&pqVar20->field_0x4;
        uVar1 = pqVar20->sequence;
        uVar2 = *(undefined8 *)(pqVar20->cid).cid;
        uVar3 = *(undefined8 *)((pqVar20->cid).cid + 8);
        uVar4 = *(undefined8 *)((pqVar20->cid).cid + 0x10);
        uVar5 = *(undefined8 *)(pqVar20->stateless_reset_token + 3);
        uVar6 = *(undefined8 *)(pqVar20->stateless_reset_token + 0xb);
        eVar13 = pqVar19->state;
        uVar14 = *(undefined4 *)&pqVar19->field_0x4;
        uVar7 = pqVar19->sequence;
        uVar8 = *(undefined8 *)(pqVar19->cid).cid;
        uVar9 = *(undefined8 *)((pqVar19->cid).cid + 8);
        uVar10 = *(undefined8 *)((pqVar19->cid).cid + 0x10);
        uVar11 = *(undefined8 *)(pqVar19->stateless_reset_token + 3);
        uVar12 = *(undefined8 *)(pqVar19->stateless_reset_token + 0xb);
        *(undefined8 *)((pqVar20->cid).cid + 8) = *(undefined8 *)((pqVar19->cid).cid + 8);
        *(undefined8 *)((pqVar20->cid).cid + 0x10) = uVar10;
        *(undefined8 *)(pqVar20->stateless_reset_token + 3) = uVar11;
        *(undefined8 *)(pqVar20->stateless_reset_token + 0xb) = uVar12;
        pqVar20->state = eVar13;
        *(undefined4 *)&pqVar20->field_0x4 = uVar14;
        pqVar20->sequence = uVar7;
        *(undefined8 *)(pqVar20->cid).cid = uVar8;
        *(undefined8 *)((pqVar20->cid).cid + 8) = uVar9;
        *(undefined8 *)((pqVar19->cid).cid + 8) = uVar3;
        *(undefined8 *)((pqVar19->cid).cid + 0x10) = uVar4;
        *(undefined8 *)(pqVar19->stateless_reset_token + 3) = uVar5;
        *(undefined8 *)(pqVar19->stateless_reset_token + 0xb) = uVar6;
        pqVar19->state = eVar15;
        *(undefined4 *)&pqVar19->field_0x4 = uVar16;
        pqVar19->sequence = uVar1;
        *(undefined8 *)(pqVar19->cid).cid = uVar2;
        *(undefined8 *)((pqVar19->cid).cid + 8) = uVar3;
        break;
      }
      pqVar20 = pqVar20 + 1;
    }
  }
  return (int)bVar22;
}

Assistant:

int quicly_local_cid_on_lost(quicly_local_cid_set_t *set, uint64_t sequence)
{
    size_t i = find_index(set, sequence);
    if (i == SIZE_MAX)
        return has_pending(set);

    /* if it's already delivered, ignore the packet loss event (no need for retransmission) */
    if (set->cids[i].state == QUICLY_LOCAL_CID_STATE_DELIVERED)
        return has_pending(set);

    do_mark_pending(set, i);

    return 1;
}